

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

date_t duckdb::DateTrunc::
       UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::DecadeOperator>(date_t input)

{
  bool bVar1;
  date_t dVar2;
  
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if (bVar1) {
    dVar2 = DecadeOperator::Operation<duckdb::date_t,duckdb::date_t>(input);
    return (date_t)dVar2.days;
  }
  dVar2 = Cast::Operation<duckdb::date_t,duckdb::date_t>(input);
  return (date_t)dVar2.days;
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}